

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O3

CURLcode Curl_ntlm_core_mk_ntlmv2_hash
                   (char *user,size_t userlen,char *domain,size_t domlen,uchar *ntlmhash,
                   uchar *ntlmv2hash)

{
  size_t uznum;
  char cVar1;
  uint uVar2;
  CURLcode CVar3;
  void *pvVar4;
  size_t sVar5;
  uchar *output;
  
  if ((-1 < (long)(domlen | userlen)) && (-1 < (long)(domlen + userlen))) {
    uznum = (domlen + userlen) * 2;
    output = ntlmhash;
    pvVar4 = (*Curl_cmalloc)(uznum);
    if (pvVar4 != (void *)0x0) {
      if (userlen != 0) {
        sVar5 = 0;
        do {
          cVar1 = Curl_raw_toupper(user[sVar5]);
          *(char *)((long)pvVar4 + sVar5 * 2) = cVar1;
          *(undefined1 *)((long)pvVar4 + sVar5 * 2 + 1) = 0;
          sVar5 = sVar5 + 1;
        } while (userlen != sVar5);
      }
      if (domlen != 0) {
        sVar5 = 0;
        do {
          *(char *)((long)pvVar4 + sVar5 * 2 + userlen * 2) = domain[sVar5];
          *(undefined1 *)((long)pvVar4 + sVar5 * 2 + userlen * 2 + 1) = 0;
          sVar5 = sVar5 + 1;
        } while (domlen != sVar5);
      }
      uVar2 = curlx_uztoui(uznum);
      CVar3 = hmac_md5(ntlmhash,(uint)pvVar4,(uchar *)(ulong)uVar2,(uint)ntlmv2hash,output);
      (*Curl_cfree)(pvVar4);
      return CVar3;
    }
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_ntlm_core_mk_ntlmv2_hash(const char *user, size_t userlen,
                                       const char *domain, size_t domlen,
                                       unsigned char *ntlmhash,
                                       unsigned char *ntlmv2hash)
{
  /* Unicode representation */
  size_t identity_len;
  unsigned char *identity;
  CURLcode result = CURLE_OK;

  /* we do the length checks below separately to avoid integer overflow risk
     on extreme data lengths */
  if((userlen > SIZE_T_MAX/2) ||
     (domlen > SIZE_T_MAX/2) ||
     ((userlen + domlen) > SIZE_T_MAX/2))
    return CURLE_OUT_OF_MEMORY;

  identity_len = (userlen + domlen) * 2;
  identity = malloc(identity_len);

  if(!identity)
    return CURLE_OUT_OF_MEMORY;

  ascii_uppercase_to_unicode_le(identity, user, userlen);
  ascii_to_unicode_le(identity + (userlen << 1), domain, domlen);

  result = hmac_md5(ntlmhash, 16, identity, curlx_uztoui(identity_len),
                    ntlmv2hash);
  free(identity);

  return result;
}